

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerResults.cpp
# Opt level: O3

void __thiscall
PS2KeyboardAnalyzerResults::GenerateExportFile
          (PS2KeyboardAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  double dVar1;
  bool bVar2;
  undefined4 uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  ulonglong uVar7;
  ulong uVar8;
  size_t sVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulonglong uVar12;
  ulong uVar13;
  uint uVar14;
  char *__format;
  PS2KeyboardAnalyzerResults *pPVar15;
  Frame *this_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char codetype [32];
  char device_str [16];
  Frame frame;
  PS2KeyboardAnalyzerResults *local_678;
  ulong local_670;
  byte local_667;
  char key_str [64];
  char tmp_str [128];
  char num_str [128];
  ofstream file_stream;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char time_str [128];
  
  std::ofstream::ofstream(&file_stream,file,_S_out);
  uVar7 = Analyzer::GetTriggerSample();
  uVar5 = Analyzer::GetSampleRate();
  if (export_type_user_id == 0) {
    dVar1 = this->mSettings->mDeviceType;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      uVar8 = AnalyzerResults::GetNumFrames();
      if (uVar8 != 0) {
        uVar5 = 1;
        uVar7 = 0;
        do {
          AnalyzerResults::GetFrame((ulonglong)num_str);
          cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
          if (cVar4 != '\0') {
            std::ofstream::close();
            this_00 = (Frame *)num_str;
            goto LAB_001085e9;
          }
          Frame::~Frame((Frame *)num_str);
          uVar7 = (ulonglong)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar7 < uVar8);
      }
    }
    else {
      uVar8 = AnalyzerResults::GetNumFrames();
      if (uVar8 != 0) {
        uVar7 = 0;
        uVar11 = 1;
        do {
          pPVar15 = (PS2KeyboardAnalyzerResults *)tmp_str;
          AnalyzerResults::GetFrame((ulonglong)tmp_str);
          cVar4 = tmp_str[0x21];
          GetKey(pPVar15,num_str,CONCAT17(tmp_str[0x17],tmp_str._16_7_),(byte)tmp_str[0x21] & 8);
          if ((cVar4 & 2U) == 0) {
            if (-1 < cVar4) {
              if (0x3f < (byte)cVar4) {
                builtin_strncpy(num_str + 8,"REAK]",6);
                uVar10 = 0x422f45535541505b;
LAB_001084bb:
                num_str[0] = (char)uVar10;
                num_str._1_5_ = (undefined5)((ulong)uVar10 >> 8);
                num_str[6] = (char)((ulong)uVar10 >> 0x30);
                num_str[7] = (char)((ulong)uVar10 >> 0x38);
                goto LAB_001084c6;
              }
              if ((cVar4 & 0x10U) == 0 || (byte)cVar4 < 0x20) {
                if (0x1f < (byte)cVar4) {
                  builtin_strncpy(num_str + 8,"CREEN]",7);
                  uVar10 = 0x5320544e4952505b;
                  goto LAB_001084bb;
                }
                if ((~cVar4 & 0x18U) != 0) {
                  if (0xf < (byte)cVar4) goto LAB_0010848b;
                  goto LAB_001084c6;
                }
              }
            }
LAB_00108495:
            num_str[0] = '\0';
          }
          else {
            if ((tmp_str._24_7_ & 1) != 0) goto LAB_00108495;
            if (((tmp_str._24_7_ & 2) != 0) || ((tmp_str._24_7_ & 4) != 0)) {
LAB_0010848b:
              num_str[0] = '\0';
            }
          }
LAB_001084c6:
          sVar9 = strlen(num_str);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,num_str,sVar9);
          cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
          if (cVar4 != '\0') {
            std::ofstream::close();
            this_00 = (Frame *)tmp_str;
            goto LAB_001085e9;
          }
          Frame::~Frame((Frame *)tmp_str);
          bVar2 = uVar11 < uVar8;
          uVar7 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar2);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&file_stream,"Time [s], Originator, Type, Details, Raw Data",0x2d);
    std::ios::widen((char)(ostream *)&file_stream + (char)*(undefined8 *)(_file_stream + -0x18));
    std::ostream::put((char)&file_stream);
    std::ostream::flush();
    uVar8 = AnalyzerResults::GetNumFrames();
    if (uVar8 != 0) {
      uVar14 = 1;
      uVar12 = 0;
      do {
        AnalyzerResults::GetFrame((ulonglong)&frame);
        pPVar15 = _frame;
        AnalyzerHelpers::GetTimeString((ulonglong)_frame,uVar7,uVar5,time_str,0x80);
        if ((local_667 & 1) == 0) {
          dVar1 = this->mSettings->mDeviceType;
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            builtin_strncpy(device_str,"Mouse",6);
            uVar3 = device_str._0_4_;
            device_str._0_8_ = CONCAT44(device_str._4_4_,uVar3);
            GetKeyName(pPVar15,num_str,(U64)local_678,local_667 & 8);
            if ((local_667 & 2) == 0) {
              if ((local_667 & 0x20) == 0) {
                AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,8,key_str,0x80);
                strcpy(tmp_str,key_str);
                codetype._4_4_ = SUB84(codetype._0_8_,4) & 0xffffff00;
                builtin_strncpy(codetype,"DATA",4);
                num_str[0] = '\0';
              }
              else {
                AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,0x20,key_str,0x80)
                ;
                strcpy(tmp_str,key_str);
                builtin_strncpy(codetype,"MOVEMENT",9);
                dVar1 = this->mSettings->mDeviceType;
                uVar13 = (ulong)((byte)(((ulong)local_678 & 0xffffffff) >> 7) & 1);
                uVar11 = (ulong)((byte)(((ulong)local_678 & 0xffffffff) >> 6) & 1);
                uVar16 = (ulong)((byte)(((ulong)local_678 & 0xffffffff) >> 5) & 1);
                uVar6 = (uint)((byte)(((ulong)local_678 & 0xffffffff) >> 4) & 1);
                uVar19 = (ulong)((byte)(((ulong)local_678 & 0xffffffff) >> 2) & 1);
                uVar17 = (ulong)((byte)(((ulong)local_678 & 0xffffffff) >> 1) & 1);
                uVar18 = (ulong)((byte)local_678 & 1);
                uVar20 = (uint)((ulong)local_678 >> 8);
                uVar21 = (uint)((ulong)local_678 >> 0x10);
                if ((dVar1 != 1.0) || (NAN(dVar1))) {
                  sprintf(num_str,
                          "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d"
                          ,uVar13,uVar11,uVar16,(ulong)uVar6,uVar19,uVar17,uVar18,0,
                          (ulong)((uint)((ulong)local_678 >> 0x1d) & 1),(ulong)(uVar20 & 0xff),
                          (ulong)(uVar21 & 0xff),(ulong)((uint)local_678 >> 0x18 & 0xf));
                }
                else {
                  sprintf(num_str,
                          "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left Btn: %d, deltaX: %d, deltaY: %d"
                          ,uVar13,uVar11,uVar16,(ulong)uVar6,uVar19,uVar17,uVar18,
                          (ulong)(uVar20 & 0xff),(ulong)(uVar21 & 0xff));
                }
              }
            }
            else if ((local_670 & 1) == 0) {
              if ((local_670 & 4) != 0) {
                AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,8,key_str,0x80);
                strcpy(tmp_str,key_str);
                builtin_strncpy(codetype,"BAT",4);
                builtin_strncpy(num_str,"Power-On Self Test Successfull",0x1f);
              }
            }
            else {
              AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,8,key_str,0x80);
              strcpy(tmp_str,key_str);
              builtin_strncpy(codetype,"ACK",4);
              num_str[0] = '\0';
            }
            strcpy(key_str,tmp_str);
            sVar9 = strlen(time_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,time_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(device_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,device_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(codetype);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,codetype,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(num_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,num_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(key_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,key_str,sVar9);
            cVar4 = (char)(ostream *)&file_stream;
            std::ios::widen((char)*(undefined8 *)(_file_stream + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
          }
          else {
            builtin_strncpy(device_str,"Keyboard",9);
            pPVar15 = local_678;
            AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,8,num_str,0x20);
            GetKeyName(pPVar15,key_str,(U64)local_678,local_667 & 8);
            if ((local_667 & 2) == 0) {
              if ((char)local_667 < '\0') {
                strcpy(tmp_str,num_str);
                builtin_strncpy(codetype,"ERROR",6);
                builtin_strncpy(key_str,"INVALID CODE",0xd);
              }
              else {
                if (local_667 < 0x40) {
                  if ((local_667 & 0x10) == 0 || local_667 < 0x20) {
                    if (local_667 < 0x20) {
                      if ((~local_667 & 0x18) == 0) {
                        __format = "0xE0, 0xF0, %s";
LAB_00107a50:
                        sprintf(tmp_str,__format,num_str);
                        builtin_strncpy(codetype,"BREAK",6);
                      }
                      else {
                        if ((local_667 & 8) == 0) {
                          if ((local_667 & 0x10) != 0) {
                            __format = "0xF0, %s";
                            goto LAB_00107a50;
                          }
                          strcpy(tmp_str,num_str);
                        }
                        else {
                          sprintf(tmp_str,"0xE0, %s",num_str);
                        }
                        builtin_strncpy(codetype,"MAKE",5);
                      }
                      goto LAB_001081fc;
                    }
                    builtin_strncpy(tmp_str + 8,"12, 0xE0, 0x7C",0xf);
                    builtin_strncpy(codetype,"MAKE",5);
                  }
                  else {
                    builtin_strncpy(tmp_str + 8,"F0, 0x7C, 0xE0, 0xF0, 0x12",0x1b);
                    builtin_strncpy(codetype,"BREAK",6);
                  }
                  builtin_strncpy(tmp_str,"0xE0, 0x",8);
                  builtin_strncpy(key_str + 1,"PRINT SCREEN]",0xe);
                }
                else {
                  builtin_strncpy(tmp_str,"0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77",0x2f);
                  codetype._0_8_ = codetype._0_8_ & 0xffffffffffffff00;
                  builtin_strncpy(key_str + 1,"PAUSE/BREAK]",0xd);
                }
                key_str[0] = '[';
              }
            }
            else if ((local_670 & 1) == 0) {
              if ((local_670 & 2) == 0) {
                if ((local_670 & 4) != 0) {
                  strcpy(tmp_str,num_str);
                  builtin_strncpy(codetype,"BAT",4);
                  builtin_strncpy(key_str,"Power-On Self Test Successfull",0x1f);
                }
              }
              else {
                strcpy(tmp_str,num_str);
                codetype._4_4_ = SUB84(codetype._0_8_,4) & 0xffffff00;
                builtin_strncpy(codetype,"ECHO",4);
                key_str[0] = '\0';
              }
            }
            else {
              strcpy(tmp_str,num_str);
              builtin_strncpy(codetype,"ACK",4);
              key_str[0] = '\0';
            }
LAB_001081fc:
            strcpy(num_str,tmp_str);
            sVar9 = strlen(time_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,time_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(device_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,device_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(codetype);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,codetype,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(key_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,key_str,sVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
            sVar9 = strlen(num_str);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&file_stream,num_str,sVar9);
            cVar4 = (char)(ostream *)&file_stream;
            std::ios::widen((char)*(undefined8 *)(_file_stream + -0x18) + cVar4);
            std::ostream::put(cVar4);
            std::ostream::flush();
          }
        }
        else {
          device_str._4_4_ = SUB84(device_str._0_8_,4) & 0xffffff00;
          builtin_strncpy(device_str,"Host",4);
          pPVar15 = local_678;
          AnalyzerHelpers::GetNumberString((ulonglong)local_678,Hexadecimal,8,tmp_str,0x20);
          GetCommandName(pPVar15,key_str,(U64)local_678,this->mSettings->mDeviceType);
          sprintf(num_str,"%s: %s (%s)",device_str,key_str,tmp_str);
          sVar9 = strlen(time_str);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,time_str,sVar9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
          sVar9 = strlen(device_str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&file_stream,device_str,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",,",2);
          sVar9 = strlen(key_str);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,key_str,sVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,",",1);
          sVar9 = strlen(tmp_str);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&file_stream,tmp_str,sVar9);
          cVar4 = (char)(ostream *)&file_stream;
          std::ios::widen((char)*(undefined8 *)(_file_stream + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
        }
        cVar4 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
        if (cVar4 != '\0') {
          std::ofstream::close();
          this_00 = &frame;
LAB_001085e9:
          Frame::~Frame(this_00);
          goto LAB_001085ee;
        }
        Frame::~Frame(&frame);
        uVar12 = (ulonglong)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar12 < uVar8);
    }
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
  std::ofstream::close();
LAB_001085ee:
  _file_stream = _VTT;
  *(undefined8 *)(&file_stream + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void PS2KeyboardAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    if( export_type_user_id == 0 )
    {
        if( mSettings->mDeviceType == 0 )
        {
            // keys as text file, no output for mouse
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                char key_str[ 64 ];

                // set the key based on the data, then if the context of the transmissions means its not correct, just make it an empty
                // string
                GetKey( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                // context checking, only allows make codes to generate a character in the file
                if( frame.mFlags & DATA_FRAME )
                {
                    if( frame.mData2 & ACK_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & ECHO_FRAME )
                        sprintf( key_str, "" );
                    else if( frame.mData2 & BAT_FRAME )
                        sprintf( key_str, "" );
                }
                else if( frame.mFlags & ERROR_FRAME )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PAUSE_BREAK )
                    sprintf( key_str, "[PAUSE/BREAK]" );
                else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & PRINT_SCREEN )
                    sprintf( key_str, "[PRINT SCREEN]" );
                else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );
                else if( frame.mFlags & BREAK_CODE )
                    sprintf( key_str, "" );

                file_stream << key_str;

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
        else
        {
            // no output for mouse, but don't want the program to crash so put this here for stability
            U64 num_frames = GetNumFrames();
            for( U32 i = 0; i < num_frames; i++ )
            {
                Frame frame = GetFrame( i );

                if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
                {
                    file_stream.close();
                    return;
                }
            }
        }
    }
    else
    {
        // csv data log file, mouse & keyboard support

        // print column titles
        file_stream << "Time [s], Originator, Type, Details, Raw Data" << std::endl;

        U64 num_frames = GetNumFrames();
        for( U32 i = 0; i < num_frames; i++ )
        {
            Frame frame = GetFrame( i );

            char time_str[ 128 ];
            AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

            char device_str[ 16 ];
            if( frame.mFlags & TX_HOST_TO_DEVICE )
            {
                sprintf( device_str, "Host" );

                char num_str[ 128 ];
                AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                char cmd_str[ 64 ];
                GetCommandName( cmd_str, frame.mData1, mSettings->mDeviceType );

                char result_str[ 255 ];

                // add key str
                sprintf( result_str, "%s: %s (%s)", device_str, cmd_str, num_str );

                file_stream << time_str << "," << device_str << ",," << cmd_str << "," << num_str << std::endl;
            }
            else
            {
                if( mSettings->mDeviceType == 0 )
                {
                    sprintf( device_str, "Keyboard" );

                    char num_str[ 128 ];
                    AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 32 );

                    char tmp_str[ 128 ];
                    char codetype[ 32 ];

                    char key_str[ 64 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );


                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & ECHO_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ECHO" );

                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & ERROR_FRAME )
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "ERROR" );
                        sprintf( key_str, "INVALID CODE" );
                    }
                    else if( frame.mFlags & PAUSE_BREAK )
                    {
                        sprintf( tmp_str, "0xE1, 0x14, 0x77, 0xE1, 0xF0, 0x14, 0xF0, 0x77" );
                        sprintf( codetype, "" );
                        sprintf( key_str, "[PAUSE/BREAK]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, 0x7C, 0xE0, 0xF0, 0x12" );
                        sprintf( codetype, "BREAK" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & PRINT_SCREEN )
                    {
                        sprintf( tmp_str, "0xE0, 0x12, 0xE0, 0x7C" );
                        sprintf( codetype, "MAKE" );
                        sprintf( key_str, "[PRINT SCREEN]" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY && frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xE0, 0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else if( frame.mFlags & EXTENDED_KEY )
                    {
                        sprintf( tmp_str, "0xE0, %s", num_str );
                        sprintf( codetype, "MAKE" );
                    }
                    else if( frame.mFlags & BREAK_CODE )
                    {
                        sprintf( tmp_str, "0xF0, %s", num_str );
                        sprintf( codetype, "BREAK" );
                    }
                    else
                    {
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MAKE" );
                    }

                    sprintf( num_str, "%s", tmp_str );

                    // write the info to the file
                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
                else
                {
                    sprintf( device_str, "Mouse" );

                    char num_str[ 128 ];

                    char tmp_str[ 256 ];
                    char codetype[ 32 ];

                    char key_str[ 512 ];
                    GetKeyName( key_str, frame.mData1, frame.mFlags & EXTENDED_KEY );

                    if( frame.mFlags & DATA_FRAME )
                    {
                        if( frame.mData2 & ACK_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "ACK" );
                            sprintf( key_str, "" );
                        }
                        else if( frame.mData2 & BAT_FRAME )
                        {
                            AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                            sprintf( tmp_str, "%s", num_str );
                            sprintf( codetype, "BAT" );

                            sprintf( key_str, "Power-On Self Test Successfull" );
                        }
                    }
                    else if( frame.mFlags & MOVEMENT_FRAME )
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 32, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "MOVEMENT" );

                        U8 YOverflow = ( frame.mData1 & 0x80 ) >> 7;
                        U8 XOverflow = ( frame.mData1 & 0x40 ) >> 6;
                        U8 YSignBit = ( frame.mData1 & 0x20 ) >> 5;
                        U8 XSignBit = ( frame.mData1 & 0x10 ) >> 4;
                        U8 MiddleButton = ( frame.mData1 & 0x04 ) >> 2;
                        U8 RightButton = ( frame.mData1 & 0x02 ) >> 1;
                        U8 LeftButton = frame.mData1 & 0x01;

                        U8 Xmovement = ( frame.mData1 & 0xFF00 ) >> 8;
                        U8 Ymovement = ( frame.mData1 & 0xFF0000 ) >> 16;

                        if( mSettings->mDeviceType == 1 )
                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, deltaX: %d, deltaY: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, Xmovement,
                                     Ymovement );
                        else
                        {
                            U8 FifthButton = ( frame.mData1 & 0x20000000 ) >> 29;
                            U8 FourthButton = ( frame.mData1 & 0x1000000 ) >> 28;
                            U8 Zmovement = ( frame.mData1 & 0x0F000000 ) >> 24;

                            sprintf( key_str,
                                     "Y Overflow: %d, X Overflow: %d, Y Sign Bit: %d, X Sign Bit: %d, Middle Btn: %d, Right Btn: %d, Left "
                                     "Btn: %d, 4th Btn: %d, 5th Btn: %d, deltaX: %d, deltaY: %d, deltaZ: %d",
                                     YOverflow, XOverflow, YSignBit, XSignBit, MiddleButton, RightButton, LeftButton, FourthButton,
                                     FifthButton, Xmovement, Ymovement, Zmovement );
                        }
                    }
                    else
                    {
                        AnalyzerHelpers::GetNumberString( frame.mData1, Hexadecimal, 8, num_str, 128 );
                        sprintf( tmp_str, "%s", num_str );
                        sprintf( codetype, "DATA" );

                        sprintf( key_str, "" );
                    }
                    sprintf( num_str, "%s", tmp_str );

                    file_stream << time_str << "," << device_str << "," << codetype << "," << key_str << "," << num_str << std::endl;
                }
            }

            if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
            {
                file_stream.close();
                return;
            }
        }
    }

    UpdateExportProgressAndCheckForCancel( 0, 0 );
    file_stream.close();
}